

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_util.h
# Opt level: O0

uint fls_u64(uint64_t x)

{
  uint uVar1;
  unsigned_long in_RDI;
  
  uVar1 = fls_lu(in_RDI);
  return uVar1;
}

Assistant:

static inline unsigned
fls_u64(uint64_t x) {
#if LG_SIZEOF_LONG == 3
	return fls_lu(x);
#elif LG_SIZEOF_LONG_LONG == 3
	return fls_llu(x);
#else
#error No implementation for 64-bit fls()
#endif
}